

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O3

int __thiscall TPZFMatrix<long_double>::Zero(TPZFMatrix<long_double> *this)

{
  memset(this->fElem,0,
         (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow *
         (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol * 0x10);
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDecomposed = '\0';
  return 1;
}

Assistant:

inline int TPZFMatrix<TVar>::Zero() {
    int64_t size = this->fRow * this->fCol * sizeof(TVar);
    memset(((void*)this->fElem),'\0',size);
    this->fDecomposed = 0;
    return( 1 );
}